

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)

{
  uint uVar1;
  jx9_user_func *pjVar2;
  anon_union_8_3_18420de5_for_x *pObj;
  anon_union_8_3_18420de5_for_x nId;
  jx9_value *pjVar3;
  unqlite_kv_engine *puVar4;
  unqlite_kv_methods *puVar5;
  _func_void_unqlite_kv_cursor_ptr *p_Var6;
  void *pvVar7;
  sxi32 sVar8;
  int iVar9;
  unqlite_col *pCol;
  char *pcVar10;
  int iFlag;
  jx9_real jVar11;
  jx9_vm *pVm;
  unqlite *pDb;
  int nByte;
  SyString sName;
  uint local_8c;
  SyString local_88;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (argc < 2) {
    pjVar2 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar10 = "Missing collection name and/or records";
LAB_001186d1:
    jx9VmThrowError(pVm,&pjVar2->sName,1,pcVar10);
  }
  else {
    pcVar10 = jx9_value_to_string(*argv,(int *)&local_8c);
    if ((int)local_8c < 1) {
      pjVar2 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar10 = "Invalid collection name";
      goto LAB_001186d1;
    }
    local_88.nByte = local_8c;
    local_88.zString = pcVar10;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_88,iFlag);
    if (pCol == (unqlite_col *)0x0) {
      jVar11 = 0.0;
      jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&local_88);
      goto LAB_001186dd;
    }
    pObj = &argv[1]->x;
    jx9MemObjToInteger((jx9_value *)pObj);
    nId = (anon_union_8_3_18420de5_for_x)pObj->iVal;
    pjVar3 = argv[2];
    if (((pjVar3->iFlags & 0x40) != 0) && ((((jx9_hashmap *)(pjVar3->x).pOther)->iFlags & 1) == 0))
    {
      sVar8 = jx9HashmapWalk((jx9_hashmap *)(pjVar3->x).pOther,CollectionRecordArrayWalker,pCol);
      jVar11 = (jx9_real)(ulong)(sVar8 == 0);
      goto LAB_001186dd;
    }
    pDb = pCol->pVm->pDb;
    if (pCol->nTotRec == 0x7fffffffffffffff) {
      pcVar10 = "Collection \'%z\': Records limit reached";
LAB_0011881c:
      jVar11 = 0.0;
      unqliteGenErrorFormat(pDb,pcVar10,&pCol->sName);
      goto LAB_001186dd;
    }
    puVar4 = ((pDb->sDB).pPager)->pEngine;
    puVar5 = puVar4->pIo->pMethods;
    if (puVar5->xReplace ==
        (_func_int_unqlite_kv_engine_ptr_void_ptr_int_void_ptr_unqlite_int64 *)0x0) {
      pcVar10 = 
      "Cannot store record into collection \'%z\' due to a read-only Key/Value storage engine";
      goto LAB_0011881c;
    }
    (pCol->sWorker).nByte = 0;
    uVar1 = (pCol->sWorker).nFlags;
    if ((uVar1 & 4) != 0) {
      (pCol->sWorker).pBlob = (void *)0x0;
      (pCol->sWorker).mByte = 0;
      (pCol->sWorker).nFlags = uVar1 & 0xfffffffb;
    }
    SyBlobFormat(&pCol->sWorker,"%z_%qd",&pCol->sName,nId.rVal);
    p_Var6 = pCol->pCursor->pStore->pIo->pMethods->xReset;
    if (p_Var6 != (_func_void_unqlite_kv_cursor_ptr *)0x0) {
      (*p_Var6)(pCol->pCursor);
    }
    iVar9 = unqlite_kv_cursor_seek(pCol->pCursor,(pCol->sWorker).pBlob,(pCol->sWorker).nByte,1);
    if (iVar9 != 0) {
      pDb = pCol->pVm->pDb;
      pcVar10 = "No record to update in collection \'%z\'";
      goto LAB_0011881c;
    }
    if (((pjVar3->iFlags & 0x40) != 0) && ((*(byte *)((pjVar3->x).iVal + 0x40) & 1) != 0)) {
      local_68 = pCol->pVm->pJx9Vm;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_70 = 2;
      local_78 = nId;
      pjStack_60 = local_68;
      jx9_array_add_strkey_elem(pjVar3,"__id",(jx9_value *)&local_78);
      jx9MemObjRelease((jx9_value *)&local_78);
    }
    uVar1 = (pCol->sWorker).nByte;
    if ((ulong)uVar1 != 0) {
      jVar11 = 0.0;
      sVar8 = FastJsonEncode(pjVar3,&pCol->sWorker,0);
      if (sVar8 != 0) goto LAB_001186dd;
      pvVar7 = (pCol->sWorker).pBlob;
      iVar9 = (*puVar5->xReplace)(puVar4,pvVar7,uVar1,(void *)((ulong)uVar1 + (long)pvVar7),
                                  (ulong)((pCol->sWorker).nByte - uVar1));
      if (iVar9 == 0) {
        CollectionCacheInstallRecord(pCol,nId.iVal,pjVar3);
        jVar11 = 4.94065645841247e-324;
        goto LAB_001186dd;
      }
      pDb = pCol->pVm->pDb;
      pcVar10 = "IO error while storing record into collection \'%z\'";
      goto LAB_0011881c;
    }
    unqliteGenError(pCol->pVm->pDb,"unQLite is running out of memory");
  }
  jVar11 = 0.0;
LAB_001186dd:
  pjVar3 = pCtx->pRet;
  jx9MemObjRelease(pjVar3);
  (pjVar3->x).rVal = jVar11;
  pjVar3->iFlags = pjVar3->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_update_record(jx9_context *pCtx,int argc,jx9_value **argv)
{
    unqlite_col *pCol;
    const char *zName;
    unqlite_vm *pVm;
    SyString sName;
    jx9_int64 nId;
    int nByte;
    int rc;
    /* Extract collection name */
    if( argc < 2 ){
        /* Missing arguments */
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    zName = jx9_value_to_string(argv[0],&nByte);
    if( nByte < 1){
        jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    SyStringInitFromBuf(&sName,zName,nByte);
    pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
    /* Fetch the collection */
    pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
    if( pCol == 0 ){
        jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
        /* Return false */
        jx9_result_bool(pCtx,0);
        return JX9_OK;
    }
    /* Update a record with the given value */
    nId = jx9_value_to_int64(argv[1]);
    rc = unqliteCollectionUpdateRecord(pCol, nId, argv[2], 0);
    /* All done, return TRUE */
    jx9_result_bool(pCtx,rc == UNQLITE_OK);
    return JX9_OK;
}